

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

void __thiscall QAccessibleToolBox::QAccessibleToolBox(QAccessibleToolBox *this,QWidget *widget)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  QAccessibleWidget::QAccessibleWidget
            (&this->super_QAccessibleWidget,widget,LayeredPane,(QString *)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  *(undefined ***)&this->super_QAccessibleWidget = &PTR__QAccessibleWidget_007e2398;
  *(undefined ***)&(this->super_QAccessibleWidget).super_QAccessibleActionInterface =
       &PTR__QAccessibleToolBox_007e2468;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleToolBox::QAccessibleToolBox(QWidget *widget)
    : QAccessibleWidget(widget, QAccessible::LayeredPane)
{
    Q_ASSERT(qobject_cast<QToolBox *>(widget));
}